

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompositeATN.hpp
# Opt level: O0

void __thiscall
Centaurus::CATNNode<unsigned_char>::import_transitions
          (CATNNode<unsigned_char> *this,NFAState<unsigned_char> *state,int offset)

{
  bool bVar1;
  vector<Centaurus::NFATransition<unsigned_char>,_std::allocator<Centaurus::NFATransition<unsigned_char>_>_>
  *this_00;
  NFATransition<unsigned_char> local_78;
  reference local_40;
  NFATransition<unsigned_char> *tr;
  const_iterator __end0;
  const_iterator __begin0;
  vector<Centaurus::NFATransition<unsigned_char>,_std::allocator<Centaurus::NFATransition<unsigned_char>_>_>
  *__range2;
  int offset_local;
  NFAState<unsigned_char> *state_local;
  CATNNode<unsigned_char> *this_local;
  
  this_00 = NFABaseState<unsigned_char,_int>::get_transitions(state);
  __end0 = std::
           vector<Centaurus::NFATransition<unsigned_char>,_std::allocator<Centaurus::NFATransition<unsigned_char>_>_>
           ::begin(this_00);
  tr = (NFATransition<unsigned_char> *)
       std::
       vector<Centaurus::NFATransition<unsigned_char>,_std::allocator<Centaurus::NFATransition<unsigned_char>_>_>
       ::end(this_00);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end0,(__normal_iterator<const_Centaurus::NFATransition<unsigned_char>_*,_std::vector<Centaurus::NFATransition<unsigned_char>,_std::allocator<Centaurus::NFATransition<unsigned_char>_>_>_>
                                *)&tr);
    if (!bVar1) break;
    local_40 = __gnu_cxx::
               __normal_iterator<const_Centaurus::NFATransition<unsigned_char>_*,_std::vector<Centaurus::NFATransition<unsigned_char>,_std::allocator<Centaurus::NFATransition<unsigned_char>_>_>_>
               ::operator*(&__end0);
    NFATransition<unsigned_char>::offset(&local_78,local_40,offset);
    std::
    vector<Centaurus::NFATransition<unsigned_char>,_std::allocator<Centaurus::NFATransition<unsigned_char>_>_>
    ::push_back(&this->m_transitions,&local_78);
    NFATransition<unsigned_char>::~NFATransition(&local_78);
    __gnu_cxx::
    __normal_iterator<const_Centaurus::NFATransition<unsigned_char>_*,_std::vector<Centaurus::NFATransition<unsigned_char>,_std::allocator<Centaurus::NFATransition<unsigned_char>_>_>_>
    ::operator++(&__end0);
  }
  return;
}

Assistant:

void import_transitions(const NFAState<TCHAR>& state, int offset)
    {
        for (const auto& tr : state.get_transitions())
        {
            m_transitions.push_back(tr.offset(offset));
        }
    }